

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O2

int handle_subfield(FFSBuffer buf,FMFormat_conflict f,estate s,size_t data_offset,
                   size_t parent_offset,FMTypeDesc *t)

{
  internal_iovec *piVar1;
  cod_exec_context pcVar2;
  int iVar3;
  FMTypeEnum FVar4;
  field_marshal_info_conflict pfVar5;
  ulong uVar6;
  char *__s;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  addr_list_entry *paVar10;
  ulong uVar11;
  void *extraout_RDX;
  void *pvVar12;
  void *data;
  void *extraout_RDX_00;
  FMTypeDesc *next;
  FFSBuffer buf_00;
  FMTypeDesc *pFVar13;
  subsample_marshal_data *iofield;
  long lVar14;
  size_t tmp_data_loc;
  size_t local_c0;
  ulong local_b8;
  cod_exec_context local_b0;
  size_t local_a8;
  size_t local_a0;
  subsample_marshal_data smd;
  _FMgetFieldStruct src_spec;
  _FMgetFieldStruct local_48;
  
  switch(t->type) {
  case FMType_pointer:
    src_spec.offset = 0;
    src_spec.byte_swap = '\0';
    src_spec.src_float_format = '\0';
    src_spec.target_float_format = '\0';
    src_spec._19_5_ = 0;
    src_spec.data_type = unknown_type;
    src_spec.size = f->pointer_size;
    pvVar12 = quick_get_pointer(&src_spec,(void *)((long)buf->tmp_buffer + data_offset));
    if (pvVar12 == (void *)0x0) {
      return 1;
    }
    pfVar5 = get_marshal_info(f,t);
    if (((pfVar5 == (field_marshal_info_conflict)0x0) || (pfVar5->type != FFSDropField)) ||
       (iVar3 = (*pfVar5->drop_row_func)(s->orig_data), iVar3 == 0)) {
      if (f->recursive != 0) {
        uVar11 = 0;
        uVar6 = (ulong)(uint)s->addr_list_cnt;
        if (s->addr_list_cnt < 1) {
          uVar6 = uVar11;
        }
        sVar8 = 0xffffffffffffffff;
        for (; uVar6 * 0x10 != uVar11; uVar11 = uVar11 + 0x10) {
          if (*(void **)((long)&s->addr_list->addr + uVar11) == pvVar12) {
            sVar8 = *(size_t *)((long)&s->addr_list->offset + uVar11);
          }
        }
        if (sVar8 != 0xffffffffffffffff) {
          pvVar12 = (void *)(data_offset + (long)buf->tmp_buffer);
          iofield = (subsample_marshal_data *)&src_spec;
          break;
        }
      }
      pFVar13 = t->next;
      sVar8 = determine_size(f,buf,parent_offset,pFVar13);
      if (sVar8 != 0) {
        if ((pfVar5 == (field_marshal_info_conflict)0x0) || (pfVar5->type != FFSSubsampleArrayField)
           ) {
          data = extraout_RDX;
          if ((s->copy_all == 0) &&
             (iVar3 = field_is_flat(f,pFVar13), data = extraout_RDX_00, iVar3 != 0)) {
            sVar8 = add_data_iovec(s,(FFSBuffer)pFVar13,pvVar12,sVar8,8);
          }
          else if (s->no_leaf_copy == 0) {
            sVar8 = copy_data_to_tmp(s,buf,pvVar12,sVar8,8,&tmp_data_loc);
          }
          else {
            sVar8 = reserve_space_for_data_in_tmp(s,buf,data,sVar8,8,&tmp_data_loc);
          }
        }
        else {
          sVar9 = determine_size(f,buf,parent_offset,pFVar13->next);
          local_b8 = sVar8 / sVar9;
          local_b0 = pfVar5->ec;
          local_a0 = sVar8;
          local_c0 = allocate_tmp_space(s,buf,sVar8,8,&tmp_data_loc);
          pcVar2 = local_b0;
          smd.element_count = (int)local_b8;
          smd.dst_ptr = (void *)((long)buf->tmp_buffer + local_c0);
          smd.marshalled_count = 0;
          local_a8 = sVar9;
          smd.element_size = sVar9;
          smd.src_ptr = pvVar12;
          cod_assoc_client_data(local_b0,0x534d4450,(intptr_t)&smd);
          (*pfVar5->subsample_array_func)(pcVar2,s->orig_data,(int)local_b8);
          pFVar13 = t->next;
          if ((pFVar13->type == FMType_array) && (pFVar13->static_size == 0)) {
            local_48.byte_swap = '\0';
            local_48.src_float_format = '\0';
            local_48.target_float_format = '\0';
            local_48._19_5_ = 0;
            local_48.data_type = unknown_type;
            local_48.size = f->field_list[pFVar13->control_field_index].field_size;
            local_48.offset = (size_t)f->field_list[pFVar13->control_field_index].field_offset;
            quick_put_ulong(&local_48,(long)smd.marshalled_count,
                            (void *)((long)buf->tmp_buffer + parent_offset));
          }
          else {
            puts("Set array size failed!");
          }
          piVar1 = s->iovec;
          iVar3 = s->iovcnt;
          piVar1[iVar3].iov_len = local_a8 * (long)smd.marshalled_count;
          piVar1[iVar3].iov_offset = tmp_data_loc;
          piVar1[iVar3].iov_base = (void *)0x0;
          s->iovcnt = iVar3 + 1;
          lVar14 = local_a8 * (long)smd.marshalled_count - local_a0;
          s->output_len = s->output_len + lVar14;
          buf->tmp_buffer_in_use_size = buf->tmp_buffer_in_use_size + lVar14;
          sVar8 = local_c0;
        }
        quick_put_ulong(&src_spec,sVar8 - s->saved_offset_difference,
                        (void *)(data_offset + (long)buf->tmp_buffer));
        if (f->recursive != 0) {
          lVar14 = (long)s->addr_list_cnt;
          sVar8 = sVar8 - s->saved_offset_difference;
          if (s->addr_list_is_stack == 0) {
            if (s->malloc_addr_size == lVar14) {
              s->malloc_addr_size = lVar14 * 2;
              paVar10 = (addr_list_entry *)ffs_realloc(s->addr_list,lVar14 << 5);
              s->addr_list = paVar10;
            }
          }
          else if (s->addr_list_cnt == 100) {
            s->addr_list_is_stack = 0;
            s->malloc_addr_size = 200;
            local_c0 = sVar8;
            paVar10 = (addr_list_entry *)ffs_malloc(0xc80);
            memcpy(paVar10,s->addr_list,0x640);
            s->addr_list = paVar10;
            sVar8 = local_c0;
          }
          paVar10 = s->addr_list;
          iVar3 = s->addr_list_cnt;
          paVar10[iVar3].addr = pvVar12;
          paVar10[iVar3].offset = sVar8;
          s->addr_list_cnt = iVar3 + 1;
        }
        pFVar13 = t->next;
        iVar3 = field_is_flat(f,pFVar13);
        if (iVar3 == 0) {
          iVar3 = handle_subfield(buf,f,s,tmp_data_loc,parent_offset,pFVar13);
          return iVar3;
        }
        return 1;
      }
    }
    pvVar12 = (void *)(data_offset + (long)buf->tmp_buffer);
    iofield = (subsample_marshal_data *)&src_spec;
    sVar8 = 0;
    break;
  case FMType_array:
    lVar14 = 1;
    FVar4 = FMType_array;
    while (FVar4 == FMType_array) {
      sVar8 = (size_t)t->static_size;
      if (sVar8 == 0) {
        smd.src_ptr = (void *)0x0;
        smd.element_size = (size_t)(uint)f->field_list[t->control_field_index].field_size;
        smd._0_8_ = SEXT48(f->field_list[t->control_field_index].field_offset);
        sVar8 = quick_get_ulong((FMFieldPtr)&smd,(void *)((long)buf->tmp_buffer + parent_offset));
      }
      lVar14 = lVar14 * sVar8;
      t = t->next;
      FVar4 = t->type;
    }
    sVar8 = determine_size(f,buf,parent_offset,t);
    iVar3 = field_is_flat(f,t);
    if (iVar3 == 0) {
      lVar14 = lVar14 + 1;
      do {
        lVar14 = lVar14 + -1;
        if (lVar14 == 0) {
          return 1;
        }
        iVar3 = handle_subfield(buf,f,s,data_offset,parent_offset,t);
        data_offset = data_offset + sVar8;
      } while (iVar3 != 0);
      return 0;
    }
    return 1;
  case FMType_string:
    smd.element_count = 0;
    smd._4_4_ = 0;
    smd.src_ptr = (void *)0x0;
    smd.element_size = (size_t)(uint)f->pointer_size;
    buf_00 = (FFSBuffer)((long)buf->tmp_buffer + data_offset);
    __s = (char *)quick_get_pointer((FMFieldPtr)&smd,buf_00);
    if (__s == (char *)0x0) {
      return 1;
    }
    sVar7 = strlen(__s);
    if (s->copy_all == 0) {
      sVar8 = add_data_iovec(s,buf_00,__s,sVar7 + 1,1);
    }
    else {
      sVar8 = copy_data_to_tmp(s,buf,__s,sVar7 + 1,1,(size_t *)0x0);
      if (sVar8 == 0xffffffffffffffff) {
        return 0;
      }
    }
    sVar8 = sVar8 - s->saved_offset_difference;
    pvVar12 = (void *)(data_offset + (long)buf->tmp_buffer);
    iofield = &smd;
    break;
  case FMType_subformat:
    iVar3 = handle_subfields(buf,f->field_subformats[t->field_index],s,data_offset);
    return iVar3;
  default:
    goto LAB_0010e08d;
  }
  quick_put_ulong((FMFieldPtr)iofield,sVar8,pvVar12);
LAB_0010e08d:
  return 1;
}

Assistant:

static int
handle_subfield(FFSBuffer buf, FMFormat f, estate s, size_t data_offset, size_t parent_offset, FMTypeDesc *t)
{

    switch (t->type) {
    case FMType_pointer:
    {
	struct _FMgetFieldStruct src_spec;
	size_t size, new_offset, tmp_data_loc;
	char *ptr_value;
	field_marshal_info marshal_info;

	memset(&src_spec, 0, sizeof(src_spec));
	src_spec.size = f->pointer_size;
	ptr_value = quick_get_pointer(&src_spec, (char*)buf->tmp_buffer + data_offset);
	if (ptr_value == NULL) return 1;

	/* customized marshalling */
	if ((marshal_info = get_marshal_info(f, t)) != NULL) {
	    if (marshal_info->type == FFSDropField) {
		if (marshal_info->drop_row_func(s->orig_data)) {
		    /* drop the value */
		    quick_put_ulong(&src_spec, 0,
				    (char*)buf->tmp_buffer + data_offset);
		    return 1;
		}
	    }
	}

	if (f->recursive) {
	    ssize_t previous_offset = search_addr_list(s, ptr_value);
	    if (previous_offset != (ssize_t)-1) {
		quick_put_ulong(&src_spec, previous_offset,
				(char*)buf->tmp_buffer + data_offset);
		return 1;
	    }
	}
	size = determine_size(f, buf, parent_offset, t->next);
	if (size == 0)  {
	    quick_put_ulong(&src_spec, 0,
			    (char*)buf->tmp_buffer + data_offset);
	    return 1;
	}
	if ((marshal_info == NULL) || (marshal_info->type != FFSSubsampleArrayField)) {
	    if (!s->copy_all && field_is_flat(f, t->next)) {
		/* leave data where it sits */
		new_offset = add_data_iovec(s, buf, ptr_value, size, 8);
	    } else {
		if (s->no_leaf_copy) {
		    /* this path only used for FFSencode_no_leaf_copy() */
		    new_offset = reserve_space_for_data_in_tmp(s, buf, ptr_value, size, 8, &tmp_data_loc);
		} else {
		    new_offset = copy_data_to_tmp(s, buf, ptr_value, size, 8, &tmp_data_loc);
		}
	    }
	} else {
	    /* can't leave data where it sits */
	    /* 1. allocate temporary space for the destination array
	       2. call function to fill destination with part of source
	       3. return value is number of elements copied
	       4. adjust size of temporary to reflect actual data copied
	    */
	    size_t element_size = determine_size(f, buf, parent_offset, t->next->next);
	    size_t element_count = size / element_size;
	    cod_exec_context ec = marshal_info->ec;
	    struct subsample_marshal_data smd;
	    new_offset = allocate_tmp_space(s, buf, size, 8, &tmp_data_loc);
	    smd.element_count = (int)element_count;
	    smd.element_size = element_size;
	    smd.src_ptr = ptr_value;
	    smd.dst_ptr = (char*)buf->tmp_buffer + new_offset;
	    smd.marshalled_count = 0;
#ifdef DO_DCG
	    cod_assoc_client_data(ec,  0x534d4450, (intptr_t)&smd);
#endif
	    marshal_info->subsample_array_func(ec, s->orig_data, (int)element_count);
	    /* fixup size */
	    set_dynamic_array_size(f, buf, parent_offset, t->next, 
				   smd.marshalled_count);
	    if (size != 0) {
		s->iovec[s->iovcnt].iov_len = smd.marshalled_count * element_size;
		s->iovec[s->iovcnt].iov_offset = tmp_data_loc;
		s->iovec[s->iovcnt].iov_base = NULL;
		s->iovcnt++;
	    }
	    s->output_len -= (size - (smd.marshalled_count *element_size));
	    buf->tmp_buffer_in_use_size -= (size - (smd.marshalled_count *element_size));
	}
	quick_put_ulong(&src_spec, new_offset - s->saved_offset_difference, 
			(char*)buf->tmp_buffer + data_offset);
	if (f->recursive) {
	    add_to_addr_list(s, ptr_value, new_offset - s->saved_offset_difference);
	}
	if (field_is_flat(f, t->next)) return 1;
	return handle_subfield(buf, f, s, tmp_data_loc, parent_offset, t->next);
    }
    case FMType_string:
    {
	struct _FMgetFieldStruct src_spec;
	char *ptr_value;
	size_t size, str_offset;
	memset(&src_spec, 0, sizeof(src_spec));
	src_spec.size = f->pointer_size;
	ptr_value = quick_get_pointer(&src_spec, (char*)buf->tmp_buffer + data_offset);
	if (ptr_value == NULL) return 1;
	size = strlen(ptr_value) + 1;
	if (!s->copy_all) {
	    /* leave data where it sits */
	    str_offset = add_data_iovec(s, buf, ptr_value, size, 1);
	} else {
	    str_offset = copy_data_to_tmp(s, buf, ptr_value, size, 1, NULL);
	    if (str_offset == (size_t) -1) return 0;
	}
	quick_put_ulong(&src_spec, str_offset - s->saved_offset_difference,
			(char*)buf->tmp_buffer + data_offset);
	break;
    }
    case FMType_array:
    {
	size_t elements = 1, i;
	size_t element_size;
	FMTypeDesc *next = t;
	while (next->type == FMType_array) {
	    if (next->static_size == 0) {
		struct _FMgetFieldStruct src_spec;
		int field = next->control_field_index;
		memset(&src_spec, 0, sizeof(src_spec));
		src_spec.size = f->field_list[field].field_size;
		src_spec.offset = f->field_list[field].field_offset;
		size_t tmp = quick_get_ulong(&src_spec, (char*)buf->tmp_buffer + parent_offset);
		elements = elements * tmp;
	    } else {
		elements = elements * next->static_size;
	    }
	    next = next->next;
	}
	element_size = determine_size(f, buf, parent_offset, next);
	if (field_is_flat(f, next)) return 1;
	for (i = 0; i < elements ; i++) {
	    size_t element_offset = data_offset + i * element_size;
	    if (!handle_subfield(buf, f, s, element_offset, parent_offset, next)) return 0;
	}
	break;
    }
    case FMType_subformat:
    {
	int field_index = t->field_index;
	FMFormat subformat = f->field_subformats[field_index];
	return handle_subfields(buf, subformat, s, data_offset);
    }
    default:
	assert(0);
    }
    return 1;
}